

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::focusOutEvent(QGraphicsView *this,QFocusEvent *event)

{
  bool bVar1;
  QObject *pQVar2;
  QEvent *in_RSI;
  QWidget *in_RDI;
  QGraphicsViewPrivate *d;
  QFocusEvent *in_stack_ffffffffffffffd8;
  
  d_func((QGraphicsView *)0xa3d761);
  QWidget::focusOutEvent(in_RDI,in_stack_ffffffffffffffd8);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3d786);
  if (bVar1) {
    pQVar2 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3d79d)->
              super_QObject;
    QCoreApplication::sendEvent(pQVar2,in_RSI);
  }
  return;
}

Assistant:

void QGraphicsView::focusOutEvent(QFocusEvent *event)
{
    Q_D(QGraphicsView);
    QAbstractScrollArea::focusOutEvent(event);
    if (d->scene)
        QCoreApplication::sendEvent(d->scene, event);
}